

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void am_invoke_cancel_proc(Am_Object *cmd)

{
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object local_18;
  Am_Object invoke_window;
  Am_Object *cmd_local;
  
  invoke_window.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object(local_38,&local_18);
  done_with_invoke_window(local_38);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_invoke_cancel, (Am_Object cmd))
{
  Am_Object invoke_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  done_with_invoke_window(invoke_window);
}